

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O0

Board * create_Board(Board *board,int row,int col)

{
  Ship ship;
  bool bVar1;
  int row_00;
  int col_00;
  size_type sVar2;
  reference pvVar3;
  int local_2c;
  int local_28;
  int vec;
  int count;
  bool control;
  bool permission;
  int y;
  int x;
  int col_local;
  int row_local;
  Board *board_local;
  
  for (local_2c = 0; sVar2 = std::vector<Ship,_std::allocator<Ship>_>::size(&board->armada),
      (ulong)(long)local_2c < sVar2; local_2c = local_2c + 1) {
    bVar1 = false;
    local_28 = 0;
    while (!bVar1) {
      if (local_28 == board->row * board->column) {
        bVar1 = true;
        local_2c = local_2c + -2;
      }
      else {
        local_28 = local_28 + 1;
        row_00 = generate_random_number(row);
        col_00 = generate_random_number(col);
        pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[](&board->armada,(long)local_2c)
        ;
        bVar1 = validation(board,row_00,col_00,pvVar3);
        if (bVar1) {
          pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                             (&board->armada,(long)local_2c);
          val_Orientation(board,row_00,col_00,pvVar3);
          pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                             (&board->armada,(long)local_2c);
          if (pvVar3->orientation == 'D') {
            bVar1 = false;
          }
          else {
            pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                               (&board->armada,(long)local_2c);
            if (pvVar3->length == 1) {
              pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                                 (&board->armada,(long)local_2c);
              pvVar3->ID = 'S';
              pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                                 (&board->armada,(long)local_2c);
              Ship::set_values(pvVar3,row_00,col_00,'U',0);
              pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                                 (&board->armada,(long)local_2c);
              Board::set_position_submarine(board,pvVar3);
              bVar1 = true;
            }
            else {
              pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                                 (&board->armada,(long)local_2c);
              ship.ID = pvVar3->ID;
              ship._1_3_ = *(undefined3 *)&pvVar3->field_0x1;
              ship.length = pvVar3->length;
              ship.sRow = pvVar3->sRow;
              ship.sCol = pvVar3->sCol;
              ship.orientation = pvVar3->orientation;
              ship._17_3_ = *(undefined3 *)&pvVar3->field_0x11;
              ship.direction = pvVar3->direction;
              bVar1 = val_positioning(board,row_00,col_00,ship);
              if (bVar1) {
                pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[]
                                   (&board->armada,(long)local_2c);
                Board::set_position(board,pvVar3);
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
            }
          }
        }
        else {
          bVar1 = false;
        }
      }
    }
  }
  return board;
}

Assistant:

Board *create_Board( Board *board, int row, int col )
{
	  int x, y;//! iterators that'll have their value randomly chosen

    bool permission, control; //! controls the verification loop

    int count; //! control helper so that we can avoid infinite loops

    for( int vec = 0; vec < board->armada.size(); vec++ ) //! positioning each element of the armada from largest to smallest.
    {
        permission = false;
        count = 0;

        while( permission == false )
        {
            if( count == board->row * board->column )
            {
                permission = true;
                vec = vec - 2;
                continue;
            }
            count++;

           	//! controls the generate_random_number seed in order to avoid repetition
            x = generate_random_number( row );
            y = generate_random_number( col ); //! random value from each ship's start (x, y values from Ship class)

            //! first verification of the chosen coordinate
            control = validation( board, x, y, &board->armada[vec] );
            
			if( control == false )
            {;
                permission = false;
                continue;
            }

            //! identify the ship's orientation 
            val_Orientation( board, x, y, &board->armada[vec] );
            
			if( board->armada[vec].orientation == 'D')
            {
                permission = false;
                continue;
            }


            if( ( board->armada[vec].length == 1 ) and ( board->armada[vec].ID = 'S' ) ) //! the submarine needs only of one verification, after that it may be positioned
            {
                board->armada[vec].set_values( x, y, 'U', 0 );
                board->set_position_submarine( &board->armada[vec] );
                permission = true;
                continue;
            } 

            //! validates the positioning of the ship and its shadow
            control = val_positioning( board, x, y, board->armada[vec] );
            
			if( control == false )
            {
                permission = false;
                continue;
            }

            //! plots the ship after all verifications 
            board->set_position( &board->armada[vec] );
            permission = true;

        }

    } 
    return board;
}